

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void sha512_add(sha512 *ctx,uint8_t *data,size_t len)

{
  uint8_t uVar1;
  ulong uVar2;
  
  uVar2 = ctx->fill;
  if (uVar2 != 0) {
    while( true ) {
      if ((0x7f < uVar2) || (len == 0)) break;
      uVar1 = *data;
      data = data + 1;
      ctx->fill = uVar2 + 1;
      ctx->buffer[uVar2] = uVar1;
      uVar2 = ctx->fill;
      len = len - 1;
    }
    if (uVar2 < 0x80) {
      return;
    }
    compress(ctx->state,ctx->buffer);
    ctx->count = ctx->count + 1;
  }
  for (; 0x7f < len; len = len - 0x80) {
    compress(ctx->state,data);
    ctx->count = ctx->count + 1;
    data = data + 0x80;
  }
  memcpy(ctx->buffer,data,len);
  ctx->fill = len;
  return;
}

Assistant:

void
sha512_add(struct sha512 *ctx, const uint8_t *data, size_t len)
{
	if (ctx->fill > 0) {
		/* fill internal buffer up and compress */
		while (ctx->fill < SHA512_BLOCK_SIZE && len > 0) {
			ctx->buffer[ctx->fill++] = *data++;
			len--;
		}
		if (ctx->fill < SHA512_BLOCK_SIZE)
			return;

		compress(ctx->state, ctx->buffer);
		ctx->count++;
	}

	/* ctx->fill is now zero */

	while (len >= SHA512_BLOCK_SIZE) {
		compress(ctx->state, data);
		ctx->count++;
		
		data += SHA512_BLOCK_SIZE;
		len -= SHA512_BLOCK_SIZE;
	}

	/* save rest for next time */
	memcpy(ctx->buffer, data, len);
	ctx->fill = len;
}